

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O2

void amrex::UtilCreateDirectoryDestructive(string *path,bool callbarrier)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  ostream *os_;
  allocator local_1a1;
  Print local_1a0;
  
  if (*(int *)(DAT_006e0650 + -0x3c) == *(int *)(DAT_006e0650 + -0x30)) {
    bVar2 = FileSystem::Exists(path);
    if (bVar2) {
      iVar3 = Verbose();
      if (1 < iVar3) {
        os_ = OutStream();
        Print::Print(&local_1a0,os_);
        poVar1 = &local_1a0.ss;
        std::operator<<((ostream *)poVar1,"amrex::UtilCreateCleanDirectoryDestructive():  ");
        std::operator<<((ostream *)poVar1,(string *)path);
        std::operator<<((ostream *)poVar1," exists.  I am destroying it.  ");
        std::endl<char,std::char_traits<char>>((ostream *)poVar1);
        Print::~Print(&local_1a0);
      }
      FileSystem::RemoveAll(path);
    }
    bVar2 = FileSystem::CreateDirectories(path,0x1ed,false);
    if (!bVar2) {
      CreateDirectoryFailed(path);
    }
  }
  if (callbarrier) {
    std::__cxx11::string::string
              ((string *)&local_1a0,"amrex::UtilCreateCleanDirectoryDestructive",&local_1a1);
    ParallelDescriptor::Barrier((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  return;
}

Assistant:

void
amrex::UtilCreateDirectoryDestructive(const std::string &path, bool callbarrier)
{
  if(ParallelContext::IOProcessorSub())
  {
    if(amrex::FileExists(path))
    {
      if (amrex::Verbose() > 1) {
          amrex::Print() << "amrex::UtilCreateCleanDirectoryDestructive():  " << path
                         << " exists.  I am destroying it.  " << std::endl;
      }
      FileSystem::RemoveAll(path);
    }
    if( ! amrex::UtilCreateDirectory(path, 0755))
    {
      amrex::CreateDirectoryFailed(path);
    }
  }
  if(callbarrier)
  {
    // Force other processors to wait until directory is built.
    ParallelDescriptor::Barrier("amrex::UtilCreateCleanDirectoryDestructive");
  }
}